

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpression<const_int_&,_(Catch::Internal::Operator)0,_const_int_&>::endExpression
          (BinaryExpression<const_int_&,_(Catch::Internal::Operator)0,_const_int_&> *this)

{
  ResultBuilder *this_00;
  OfType OVar1;
  
  OVar1 = ExpressionFailed;
  if (*this->m_lhs == *this->m_rhs) {
    OVar1 = Ok;
  }
  this_00 = this->m_rb;
  (this_00->m_data).resultType = OVar1;
  ResultBuilder::endExpression(this_00,&this->super_DecomposedExpression);
  return;
}

Assistant:

void endExpression() const {
        m_rb
            .setResultType( Internal::compare<Op>( m_lhs, m_rhs ) )
            .endExpression( *this );
    }